

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O1

void __thiscall duckdb::BatchInsertLocalState::~BatchInsertLocalState(BatchInsertLocalState *this)

{
  _Head_base<0UL,_duckdb::ConstraintState_*,_false> _Var1;
  
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__BatchInsertLocalState_024a7a50;
  _Var1._M_head_impl =
       (this->constraint_state).
       super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
       .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (ConstraintState *)0x0) {
    operator_delete(_Var1._M_head_impl);
  }
  (this->constraint_state).
  super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t.
  super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>.
  super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl = (ConstraintState *)0x0;
  ::std::
  unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>::
  ~unique_ptr(&(this->optimistic_writer).
               super_unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
             );
  TableAppendState::~TableAppendState(&this->current_append_state);
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__LocalSinkState_024811c0;
  ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::~vector
            (&(this->super_LocalSinkState).partition_info.partition_data.
              super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
            );
  operator_delete(this);
  return;
}

Assistant:

BatchInsertLocalState(ClientContext &context, const vector<LogicalType> &types)
	    : collection_index(DConstants::INVALID_INDEX) {
	}